

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O0

void update_dispatch_table_for_class(Class cls)

{
  Class cls_local;
  
  if (update_dispatch_table_for_class::warned == '\0') {
    fprintf(_stderr,"Warning: Calling deprecated private ObjC runtime function %s\n",
            "update_dispatch_table_for_class");
    update_dispatch_table_for_class::warned = '\x01';
  }
  objc_update_dtable_for_class(cls);
  return;
}

Assistant:

LEGACY void update_dispatch_table_for_class(Class cls)
{
	static BOOL warned = NO;
	if (!warned)
	{
		fprintf(stderr, 
			"Warning: Calling deprecated private ObjC runtime function %s\n", __func__);
		warned = YES;
	}
	objc_update_dtable_for_class(cls);
}